

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

void __thiscall diy::FileStorage::FileStorage(FileStorage *this,string *filename_template)

{
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  *this_00;
  size_type in_RSI;
  allocator_type *in_RDI;
  critical_resource<unsigned_long,_tthread::fast_mutex> *this_01;
  unsigned_long *in_stack_ffffffffffffff98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  size_type local_10;
  
  local_10 = in_RSI;
  ExternalStorage::ExternalStorage((ExternalStorage *)in_RDI);
  *(undefined ***)in_RDI = &PTR_put_001effd8;
  this_00 = (critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
             *)(in_RDI + 8);
  this_02 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffffef;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x11519e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_02,local_10,(value_type *)this_00,in_RDI);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1151c3);
  this_01 = (critical_resource<unsigned_long,_tthread::fast_mutex> *)(in_RDI + 0x20);
  critical_resource<std::map<int,_diy::FileStorage::FileRecord,_std::less<int>,_std::allocator<std::pair<const_int,_diy::FileStorage::FileRecord>_>_>,_tthread::fast_mutex>
  ::critical_resource(this_00);
  critical_resource<int,_tthread::fast_mutex>::critical_resource
            ((critical_resource<int,_tthread::fast_mutex> *)this_01,(int *)in_stack_ffffffffffffff98
            );
  critical_resource<unsigned_long,_tthread::fast_mutex>::critical_resource
            (this_01,in_stack_ffffffffffffff98);
  critical_resource<unsigned_long,_tthread::fast_mutex>::critical_resource
            (this_01,in_stack_ffffffffffffff98);
  return;
}

Assistant:

FileStorage(const std::string& filename_template = "/tmp/DIY.XXXXXX"):
                      filename_templates_(1, filename_template),
                      count_(0), current_size_(0), max_size_(0)         {}